

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e10892::CloseButton::paintEvent(CloseButton *this,QPaintEvent *param_2)

{
  bool bVar1;
  int index_00;
  ButtonPosition position_00;
  QTabBar *this_00;
  QStyle *pQVar2;
  QWidget *pQVar3;
  QWidget *in_RDI;
  undefined8 in_R9;
  long in_FS_OFFSET;
  ButtonPosition position;
  int index;
  QTabBar *tb;
  QPainter p;
  QStyleOption opt;
  QWidget *in_stack_ffffffffffffff78;
  QAbstractButton *in_stack_ffffffffffffff80;
  QStyleOption *this_01;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  QStyleOption *in_stack_ffffffffffffff98;
  QStyleOption local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_50,&in_RDI->super_QPaintDevice);
  memset((void *)((long)&local_50 + 8),0xaa,0x40);
  QStyleOption::QStyleOption
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  QStyleOption::initFrom
            (in_stack_ffffffffffffff98,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_50.rect,State_AutoRaise)
  ;
  bVar1 = QWidget::isEnabled((QWidget *)0x6b4fbb);
  if ((((bVar1) && (bVar1 = QWidget::underMouse((QWidget *)0x6b4fcb), bVar1)) &&
      (bVar1 = QAbstractButton::isChecked(in_stack_ffffffffffffff80), !bVar1)) &&
     (bVar1 = QAbstractButton::isDown(in_stack_ffffffffffffff80), !bVar1)) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_50.rect,State_Raised);
  }
  bVar1 = QAbstractButton::isChecked(in_stack_ffffffffffffff80);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_50.rect,State_On);
  }
  bVar1 = QAbstractButton::isDown(in_stack_ffffffffffffff80);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_50.rect,State_Sunken);
  }
  QObject::parent((QObject *)0x6b5050);
  this_00 = qobject_cast<QTabBar_const*>((QObject *)0x6b5058);
  if (this_00 != (QTabBar *)0x0) {
    index_00 = QTabBar::currentIndex((QTabBar *)in_stack_ffffffffffffff78);
    pQVar2 = QWidget::style(in_stack_ffffffffffffff78);
    position_00 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x5c,0,this_00);
    pQVar3 = QTabBar::tabButton(this_00,index_00,position_00);
    if (pQVar3 == in_RDI) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&local_50.rect,State_Selected);
    }
  }
  pQVar2 = QWidget::style(in_stack_ffffffffffffff78);
  this_01 = &local_50;
  (**(code **)(*(long *)pQVar2 + 0xb0))
            (pQVar2,0x2f,(long)&local_50 + 8U,this_01,in_RDI,in_R9,(long)&local_50 + 8U);
  QStyleOption::~QStyleOption(this_01);
  QPainter::~QPainter((QPainter *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CloseButton::paintEvent(QPaintEvent *)
{
    QPainter p(this);
    QStyleOption opt;
    opt.initFrom(this);
    opt.state |= QStyle::State_AutoRaise;
    if (isEnabled() && underMouse() && !isChecked() && !isDown())
        opt.state |= QStyle::State_Raised;
    if (isChecked())
        opt.state |= QStyle::State_On;
    if (isDown())
        opt.state |= QStyle::State_Sunken;

    if (const QTabBar *tb = qobject_cast<const QTabBar *>(parent())) {
        int index = tb->currentIndex();
        QTabBar::ButtonPosition position = (QTabBar::ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, tb);
        if (tb->tabButton(index, position) == this)
            opt.state |= QStyle::State_Selected;
    }

    style()->drawPrimitive(QStyle::PE_IndicatorTabClose, &opt, &p, this);
}